

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

iterator __thiscall
estl::vector_s<Rect,6ul>::emplace<unsigned_int,unsigned_int>
          (vector_s<Rect,6ul> *this,const_iterator pos,uint *args,uint *args_1)

{
  size_type sVar1;
  size_type sVar2;
  range_error *this_00;
  iterator last;
  iterator ipos;
  size_type new_size;
  uint *args_local_1;
  uint *args_local;
  const_iterator pos_local;
  vector_s<Rect,_6UL> *this_local;
  
  sVar1 = vector_s<Rect,_6UL>::size((vector_s<Rect,_6UL> *)this);
  sVar2 = vector_s<Rect,_6UL>::capacity((vector_s<Rect,_6UL> *)this);
  if (sVar2 < sVar1 + 1) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"cas::vector_s emplace beyond capacity.");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  last = vector_s<Rect,_6UL>::end((vector_s<Rect,_6UL> *)this);
  shift_right<Rect*>(this,pos,last,1);
  Rect::Rect(pos,*args,*args_1);
  *(size_type *)this = sVar1 + 1;
  return pos;
}

Assistant:

iterator emplace( const_iterator pos, Args&&... args )
    {
        const auto new_size = size() + 1u;
        if (new_size > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s emplace beyond capacity.");
            return end();
        }

        iterator ipos = const_cast<iterator>(pos);
        shift_right(ipos, end(), 1u);
        new (static_cast<pointer>(ipos)) T(std::forward<Args>(args)...);
        size_ = new_size;
        return ipos;
    }